

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecXor.c
# Opt level: O0

Acec_Box_t *
Acec_FindBox(Gia_Man_t *p,Vec_Int_t *vAdds,Vec_Wec_t *vAddBoxes,Vec_Wec_t *vXorLeaves,
            Vec_Int_t *vXorRoots)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Bit_t *vVisit_00;
  Vec_Bit_t *p_00;
  Vec_Bit_t *p_01;
  Acec_Box_t *pAVar4;
  Vec_Wec_t *pVVar5;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  int local_144;
  Acec_Box_t *pBox;
  int Node;
  int Box;
  int k;
  int j;
  int i;
  Vec_Int_t *vMap;
  Vec_Int_t *vLevel2;
  Vec_Int_t *vLevel;
  Vec_Bit_t *vIsRoot;
  Vec_Bit_t *vIsLeaf;
  Vec_Bit_t *vVisit;
  int MaxRank;
  Vec_Int_t *vXorRoots_local;
  Vec_Wec_t *vXorLeaves_local;
  Vec_Wec_t *vAddBoxes_local;
  Vec_Int_t *vAdds_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_WecSize(vAddBoxes);
  iVar2 = Vec_IntSize(vAdds);
  vVisit_00 = Vec_BitStart(iVar2 / 6);
  iVar2 = Gia_ManObjNum(p);
  p_00 = Vec_BitStart(iVar2);
  iVar2 = Gia_ManObjNum(p);
  p_01 = Vec_BitStart(iVar2);
  pAVar4 = (Acec_Box_t *)calloc(1,0x30);
  pAVar4->pGia = p;
  pAVar4->vAdds = vAddBoxes;
  pVVar5 = Vec_WecStart(iVar1);
  pAVar4->vLeafLits = pVVar5;
  pVVar5 = Vec_WecStart(iVar1);
  pAVar4->vRootLits = pVVar5;
  iVar1 = Vec_WecSize(vAddBoxes);
  iVar2 = Vec_WecSize(vXorLeaves);
  if (iVar1 != iVar2) {
    __assert_fail("Vec_WecSize(vAddBoxes) == Vec_WecSize(vXorLeaves)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecXor.c"
                  ,0x131,
                  "Acec_Box_t *Acec_FindBox(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *)"
                 );
  }
  iVar1 = Vec_WecSize(vAddBoxes);
  iVar2 = Vec_IntSize(vXorRoots);
  if (iVar1 == iVar2) {
    for (k = 0; iVar1 = Vec_WecSize(pAVar4->vAdds), k < iVar1; k = k + 1) {
      pVVar6 = Vec_WecEntry(pAVar4->vAdds,k);
      for (Node = 0; iVar1 = Vec_IntSize(pVVar6), Node < iVar1; Node = Node + 1) {
        iVar1 = Vec_IntEntry(pVVar6,Node);
        iVar2 = Vec_IntEntry(vAdds,iVar1 * 6);
        Vec_BitWriteEntry(p_00,iVar2,1);
        iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 1);
        Vec_BitWriteEntry(p_00,iVar2,1);
        iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 2);
        Vec_BitWriteEntry(p_00,iVar2,1);
        iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 3);
        Vec_BitWriteEntry(p_01,iVar2,1);
        iVar1 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
        Vec_BitWriteEntry(p_01,iVar1,1);
      }
    }
    for (k = 0; iVar1 = Vec_WecSize(pAVar4->vAdds), k < iVar1; k = k + 1) {
      pVVar6 = Vec_WecEntry(pAVar4->vAdds,k);
      Vec_IntSort(pVVar6,0);
    }
    pVVar6 = Acec_TreeCarryMap(p,vAdds,pAVar4->vAdds);
    k = Vec_WecSize(pAVar4->vAdds);
    while (k = k + -1, -1 < k) {
      pVVar7 = Vec_WecEntry(pAVar4->vAdds,k);
      for (Node = 0; iVar1 = Vec_IntSize(pVVar7), Node < iVar1; Node = Node + 1) {
        iVar1 = Vec_IntEntry(pVVar7,Node);
        iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
        iVar2 = Vec_BitEntry(p_00,iVar2);
        if (iVar2 == 0) {
          iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 4);
          iVar1 = Vec_IntEntry(vAdds,iVar1 * 6 + 2);
          Acec_TreePhases_rec(p,vAdds,pVVar6,iVar2,(uint)(iVar1 != 0),vVisit_00);
        }
      }
    }
    Acec_TreeVerifyPhases(p,vAdds,pAVar4->vAdds);
    Acec_TreeVerifyPhases2(p,vAdds,pAVar4->vAdds);
    Vec_BitFree(vVisit_00);
    Vec_IntFree(pVVar6);
    Vec_BitWriteEntry(p_01,0,1);
    for (k = 0; iVar1 = Vec_WecSize(pAVar4->vAdds), k < iVar1; k = k + 1) {
      pVVar6 = Vec_WecEntry(pAVar4->vAdds,k);
      for (Box = 0; iVar1 = Vec_IntSize(pVVar6), Box < iVar1; Box = Box + 1) {
        iVar1 = Vec_IntEntry(pVVar6,Box);
        for (Node = 0; Node < 3; Node = Node + 1) {
          iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + Node);
          iVar2 = Vec_BitEntry(p_01,iVar2);
          if (iVar2 == 0) {
            pVVar5 = pAVar4->vLeafLits;
            iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + Node);
            iVar3 = Acec_SignBit2(vAdds,iVar1,Node);
            iVar2 = Abc_Var2Lit(iVar2,iVar3);
            Vec_WecPush(pVVar5,k,iVar2);
          }
        }
        for (Node = 3; Node < 5; Node = Node + 1) {
          iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + Node);
          iVar2 = Vec_BitEntry(p_00,iVar2);
          if (iVar2 == 0) {
            pVVar5 = pAVar4->vRootLits;
            if (Node == 4) {
              local_144 = k + 1;
            }
            else {
              local_144 = k;
            }
            iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + Node);
            iVar3 = Acec_SignBit2(vAdds,iVar1,Node);
            iVar2 = Abc_Var2Lit(iVar2,iVar3);
            Vec_WecPush(pVVar5,local_144,iVar2);
          }
        }
        iVar2 = Vec_IntEntry(vAdds,iVar1 * 6 + 2);
        if ((iVar2 == 0) && (iVar1 = Acec_SignBit2(vAdds,iVar1,2), iVar1 != 0)) {
          Vec_WecPush(pAVar4->vLeafLits,k,1);
        }
      }
    }
    Vec_BitFree(p_00);
    Vec_BitFree(p_01);
    pVVar5 = pAVar4->vLeafLits;
    iVar1 = Vec_WecSize(pAVar4->vLeafLits);
    pVVar6 = Vec_WecEntry(pVVar5,iVar1 + -1);
    iVar1 = Vec_WecSize(vXorLeaves);
    pVVar7 = Vec_WecEntry(vXorLeaves,iVar1 + -1);
    iVar1 = Vec_IntSize(pVVar6);
    if ((iVar1 == 0) && (iVar1 = Vec_IntSize(pVVar7), 0 < iVar1)) {
      for (Node = 0; iVar1 = Vec_IntSize(pVVar7), Node < iVar1; Node = Node + 1) {
        iVar1 = Vec_IntEntry(pVVar7,Node);
        iVar1 = Abc_Var2Lit(iVar1,0);
        Vec_IntPush(pVVar6,iVar1);
      }
    }
    pVVar5 = pAVar4->vRootLits;
    iVar1 = Vec_WecSize(pAVar4->vRootLits);
    pVVar6 = Vec_WecEntry(pVVar5,iVar1 + -1);
    iVar1 = Vec_IntEntryLast(vXorRoots);
    iVar1 = Abc_Var2Lit(iVar1,0);
    Vec_IntFill(pVVar6,1,iVar1);
    for (k = 0; iVar1 = Vec_WecSize(pAVar4->vLeafLits), k < iVar1; k = k + 1) {
      pVVar6 = Vec_WecEntry(pAVar4->vLeafLits,k);
      Vec_IntSort(pVVar6,0);
    }
    for (k = 0; iVar1 = Vec_WecSize(pAVar4->vRootLits), k < iVar1; k = k + 1) {
      pVVar6 = Vec_WecEntry(pAVar4->vRootLits,k);
      Vec_IntSort(pVVar6,1);
    }
    return pAVar4;
  }
  __assert_fail("Vec_WecSize(vAddBoxes) == Vec_IntSize(vXorRoots)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/acec/acecXor.c"
                ,0x132,
                "Acec_Box_t *Acec_FindBox(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *)"
               );
}

Assistant:

Acec_Box_t * Acec_FindBox( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vAddBoxes, Vec_Wec_t * vXorLeaves, Vec_Int_t * vXorRoots )
{
    extern Vec_Int_t * Acec_TreeCarryMap( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes );
    extern void Acec_TreePhases_rec( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Int_t * vMap, int Node, int fPhase, Vec_Bit_t * vVisit );
    extern void Acec_TreeVerifyPhases( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes );
    extern void Acec_TreeVerifyPhases2( Gia_Man_t * p, Vec_Int_t * vAdds, Vec_Wec_t * vBoxes );

    int MaxRank = Vec_WecSize( vAddBoxes );
    Vec_Bit_t * vVisit  = Vec_BitStart( Vec_IntSize(vAdds)/6 );
    Vec_Bit_t * vIsLeaf = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Bit_t * vIsRoot = Vec_BitStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel, * vLevel2, * vMap;
    int i, j, k, Box, Node;

    Acec_Box_t * pBox = ABC_CALLOC( Acec_Box_t, 1 );
    pBox->pGia        = p;
    pBox->vAdds       = vAddBoxes; // Vec_WecDup( vAddBoxes );
    pBox->vLeafLits   = Vec_WecStart( MaxRank + 0 );
    pBox->vRootLits   = Vec_WecStart( MaxRank + 0 );

    assert( Vec_WecSize(vAddBoxes) == Vec_WecSize(vXorLeaves) );
    assert( Vec_WecSize(vAddBoxes) == Vec_IntSize(vXorRoots) );

    // collect boxes; mark inputs/outputs
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
    Vec_IntForEachEntry( vLevel, Box, k )
    {
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+0), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+1), 1 );
        Vec_BitWriteEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+2), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+3), 1 );
        Vec_BitWriteEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+4), 1 );
    }
    // sort each level
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
        Vec_IntSort( vLevel, 0 );

    // set phases starting from roots
    vMap = Acec_TreeCarryMap( p, vAdds, pBox->vAdds );
    Vec_WecForEachLevelReverse( pBox->vAdds, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, k )
            if ( !Vec_BitEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+4) ) )
            {
                //printf( "Pushing phase of output %d of box %d\n", Vec_IntEntry(vAdds, 6*Box+4), Box );
                Acec_TreePhases_rec( p, vAdds, vMap, Vec_IntEntry(vAdds, 6*Box+4), Vec_IntEntry(vAdds, 6*Box+2) != 0, vVisit );
            }
    Acec_TreeVerifyPhases( p, vAdds, pBox->vAdds );
    Acec_TreeVerifyPhases2( p, vAdds, pBox->vAdds );
    Vec_BitFree( vVisit );
    Vec_IntFree( vMap );

    // collect inputs/outputs
    Vec_BitWriteEntry( vIsRoot, 0, 1 );
    Vec_WecForEachLevel( pBox->vAdds, vLevel, i )
        Vec_IntForEachEntry( vLevel, Box, j )
        {
            for ( k = 0; k < 3; k++ )
                if ( !Vec_BitEntry( vIsRoot, Vec_IntEntry(vAdds, 6*Box+k) ) )
                    Vec_WecPush( pBox->vLeafLits, i, Abc_Var2Lit(Vec_IntEntry(vAdds, 6*Box+k), Acec_SignBit2(vAdds, Box, k)) );
            for ( k = 3; k < 5; k++ )
                if ( !Vec_BitEntry( vIsLeaf, Vec_IntEntry(vAdds, 6*Box+k) ) )
                    Vec_WecPush( pBox->vRootLits, k == 4 ? i + 1 : i, Abc_Var2Lit(Vec_IntEntry(vAdds, 6*Box+k), Acec_SignBit2(vAdds, Box, k)) );
            if ( Vec_IntEntry(vAdds, 6*Box+2) == 0 && Acec_SignBit2(vAdds, Box, 2) )
                Vec_WecPush( pBox->vLeafLits, i, 1 );
        }
    Vec_BitFree( vIsLeaf );
    Vec_BitFree( vIsRoot );

    // collect last bit
    vLevel  = Vec_WecEntry( pBox->vLeafLits, Vec_WecSize(pBox->vLeafLits)-1 );
    vLevel2 = Vec_WecEntry( vXorLeaves, Vec_WecSize(vXorLeaves)-1 );
    if ( Vec_IntSize(vLevel) == 0 && Vec_IntSize(vLevel2) > 0 )
    {
        Vec_IntForEachEntry( vLevel2, Node, k )
            Vec_IntPush( vLevel, Abc_Var2Lit(Node, 0) );
    }
    vLevel  = Vec_WecEntry( pBox->vRootLits, Vec_WecSize(pBox->vRootLits)-1 );
    Vec_IntFill( vLevel, 1, Abc_Var2Lit(Vec_IntEntryLast(vXorRoots), 0) );

    // sort each level
    Vec_WecForEachLevel( pBox->vLeafLits, vLevel, i )
        Vec_IntSort( vLevel, 0 );
    Vec_WecForEachLevel( pBox->vRootLits, vLevel, i )
        Vec_IntSort( vLevel, 1 );

    //Acec_CheckBoothPPs( p, pBox->vLeafLits );
    return pBox;
}